

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O0

RSA * SRUP_Crypto::getPubKey(char *key_string)

{
  RSA *data;
  BIO_METHOD *type;
  BIO *b;
  size_t sVar1;
  BIO *bo;
  RSA *key;
  char *key_string_local;
  
  key = (RSA *)key_string;
  type = BIO_s_mem();
  b = BIO_new(type);
  data = key;
  sVar1 = strlen((char *)key);
  BIO_write(b,data,(int)sVar1);
  bo = (BIO *)RSA_new();
  bo = (BIO *)PEM_read_bio_RSA_PUBKEY(b,(RSA **)&bo,(undefined1 *)0x0,(void *)0x0);
  if ((RSA *)bo == (RSA *)0x0) {
    key_string_local = (char *)0x0;
  }
  else {
    BIO_free(b);
    key_string_local = (char *)bo;
  }
  return (RSA *)key_string_local;
}

Assistant:

RSA* SRUP_Crypto::getPubKey(char *key_string)
{
    RSA *key;

    BIO* bo = BIO_new(BIO_s_mem());

    BIO_write(bo, key_string, strlen(key_string));

    key = RSA_new();
    key = PEM_read_bio_RSA_PUBKEY(bo, &key, nullptr, nullptr);
    if(!key)
        return nullptr;
    BIO_free(bo);
    return key;
}